

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

blow_method * findmeth(char *meth_name)

{
  int iVar1;
  blow_method *pbVar2;
  
  pbVar2 = blow_methods + 1;
  while( true ) {
    if (pbVar2 == (blow_method *)0x0) {
      return (blow_method *)0x0;
    }
    iVar1 = strcmp(pbVar2->name,meth_name);
    if (iVar1 == 0) break;
    pbVar2 = pbVar2->next;
  }
  return pbVar2;
}

Assistant:

static struct blow_method *findmeth(const char *meth_name) {
	struct blow_method *meth = &blow_methods[1];
	while (meth) {
		if (streq(meth->name, meth_name))
			break;
		meth = meth->next;
	}
	return meth;
}